

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O0

MDHelper *
MetricsDiscovery::MDHelper::CreateEBS
          (string *metricsLibraryName,string *metricSetSymbolName,string *metricsFileName,
          uint32_t adapterIndex,bool includeMaxValues)

{
  bool bVar1;
  MDHelper *this;
  undefined4 in_ECX;
  MDHelper *in_RDX;
  undefined1 in_R8B;
  MDHelper *pMDHelper;
  uint32_t in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffcb;
  uint32_t in_stack_ffffffffffffffcc;
  string *in_stack_ffffffffffffffd0;
  MDHelper *pMVar2;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar3;
  
  uVar3 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0) & 0x1ffffff;
  this = (MDHelper *)operator_new(0x78);
  MDHelper(this,in_stack_ffffffffffffffbc);
  pMVar2 = this;
  if ((this != (MDHelper *)0x0) &&
     (bVar1 = InitMetricsDiscovery
                        (in_RDX,(string *)CONCAT44(in_ECX,uVar3),(string *)this,
                         in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                         (bool)in_stack_ffffffffffffffcb), !bVar1)) {
    Delete((MDHelper **)this);
  }
  return pMVar2;
}

Assistant:

MDHelper* MDHelper::CreateEBS(
    const std::string& metricsLibraryName,
    const std::string& metricSetSymbolName,
    const std::string& metricsFileName,
    uint32_t adapterIndex,
    bool includeMaxValues )
{
#if defined(__linux__) || defined(__FreeBSD__)
    // This is a temporary workaround until the Linux MDAPI is updated
    // to expose metrics for OpenCL.
    MDHelper*   pMDHelper = new MDHelper(API_TYPE_OCL|API_TYPE_OGL4_X);
#else
    MDHelper*   pMDHelper = new MDHelper(API_TYPE_OCL);
#endif
    if( pMDHelper )
    {
        if( pMDHelper->InitMetricsDiscovery(
                metricsLibraryName,
                metricSetSymbolName,
                metricsFileName,
                adapterIndex,
                includeMaxValues ) == false )
        {
            Delete( pMDHelper );
        }
    }
    return pMDHelper;
}